

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_service_client_auth.c
# Opt level: O3

IOTHUB_SERVICE_CLIENT_AUTH_HANDLE
create_from_connection_string(char *connectionString,_Bool useSharedAccessSignature)

{
  int iVar1;
  IOTHUB_SERVICE_CLIENT_AUTH *authInfo;
  STRING_HANDLE connection_string;
  MAP_HANDLE handle;
  char *pcVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  char *psz;
  char *source;
  STRING_HANDLE handle_00;
  STRING_TOKENIZER_HANDLE_conflict tokenizer;
  STRING_HANDLE local_60;
  STRING_HANDLE local_48;
  STRING_HANDLE local_40;
  
  if (connectionString == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
    }
    pcVar2 = "Input parameter is NULL: connectionString";
    iVar1 = 0x29;
LAB_001398de:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
              ,"create_from_connection_string",iVar1,1,pcVar2);
    return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
  }
  authInfo = (IOTHUB_SERVICE_CLIENT_AUTH *)calloc(1,0x30);
  if (authInfo == (IOTHUB_SERVICE_CLIENT_AUTH *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
    }
    pcVar2 = "Malloc failed for IOTHUB_SERVICE_CLIENT_AUTH";
    iVar1 = 0x31;
    goto LAB_001398de;
  }
  connection_string = STRING_construct(connectionString);
  if (connection_string == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",0x3a,1,"STRING_construct failed");
    }
    free_service_client_auth(authInfo);
    return (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0;
  }
  handle = connectionstringparser_parse(connection_string);
  if (handle == (MAP_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",0x43,1,"Tokenizing failed on connectionString");
    }
    free_service_client_auth(authInfo);
    authInfo = (IOTHUB_SERVICE_CLIENT_AUTH *)0x0;
    goto LAB_00139c77;
  }
  pcVar2 = Map_GetValueFromKey(handle,"SharedAccessKeyName");
  pcVar3 = Map_GetValueFromKey(handle,"DeviceId");
  authInfo->hostname = (char *)0x0;
  authInfo->iothubName = (char *)0x0;
  authInfo->iothubSuffix = (char *)0x0;
  authInfo->sharedAccessKey = (char *)0x0;
  authInfo->keyName = (char *)0x0;
  authInfo->deviceId = (char *)0x0;
  if (pcVar2 == (char *)0x0 && pcVar3 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar2 = "Couldn\'t find %s or %s in connection string";
      iVar1 = 0x5b;
LAB_001399c2:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",iVar1,1,pcVar2,"SharedAccessKeyName","DeviceId");
    }
LAB_00139c2d:
    local_40 = (STRING_HANDLE)0x0;
    local_48 = (STRING_HANDLE)0x0;
    local_60 = (STRING_HANDLE)0x0;
    tokenizer = (STRING_TOKENIZER_HANDLE_conflict)0x0;
    handle_00 = (STRING_HANDLE)0x0;
LAB_00139c32:
    free_service_client_auth(authInfo);
    authInfo = (IOTHUB_SERVICE_CLIENT_AUTH *)0x0;
  }
  else {
    if (pcVar3 != (char *)0x0 && pcVar2 != (char *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "Both %s and %s in connection string were set, they are mutually exclusive";
        iVar1 = 0x61;
        goto LAB_001399c2;
      }
      goto LAB_00139c2d;
    }
    psz = Map_GetValueFromKey(handle,"HostName");
    if (psz == (char *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139c2d;
      pcVar2 = "Couldn\'t find %s in connection string";
      iVar1 = 0x67;
LAB_00139bff:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",iVar1,1,pcVar2);
      goto LAB_00139c2d;
    }
    if (!useSharedAccessSignature) {
      source = Map_GetValueFromKey(handle,"SharedAccessKey");
      if (source != (char *)0x0) goto LAB_00139ae0;
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "Couldn\'t find %s in connection string";
        iVar1 = 0x6d;
        goto LAB_00139bff;
      }
      goto LAB_00139c2d;
    }
    source = Map_GetValueFromKey(handle,"SharedAccessSignature");
    if (source == (char *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "Couldn\'t find %s in connection string";
        iVar1 = 0x73;
        goto LAB_00139bff;
      }
      goto LAB_00139c2d;
    }
LAB_00139ae0:
    handle_00 = STRING_construct(psz);
    if (handle_00 == (STRING_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "STRING_construct failed";
        iVar1 = 0x79;
        goto LAB_00139bff;
      }
      goto LAB_00139c2d;
    }
    tokenizer = STRING_TOKENIZER_create(handle_00);
    if (tokenizer == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                  ,"create_from_connection_string",0x7f,1,"Error creating STRING tokenizer");
      }
      local_60 = (STRING_HANDLE)0x0;
      local_48 = (STRING_HANDLE)0x0;
      local_40 = (STRING_HANDLE)0x0;
      tokenizer = (STRING_TOKENIZER_HANDLE_conflict)0x0;
      goto LAB_00139c32;
    }
    local_40 = STRING_new();
    if (local_40 == (STRING_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                  ,"create_from_connection_string",0x85,1,"Error creating key token STRING_HANDLE");
      }
      local_60 = (STRING_HANDLE)0x0;
      local_48 = (STRING_HANDLE)0x0;
      local_40 = (STRING_HANDLE)0x0;
      goto LAB_00139c32;
    }
    local_48 = STRING_new();
    if (local_48 == (STRING_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                  ,"create_from_connection_string",0x8b,1,"Error creating value token STRING_HANDLE"
                 );
      }
      local_60 = (STRING_HANDLE)0x0;
      local_48 = (STRING_HANDLE)0x0;
      goto LAB_00139c32;
    }
    iVar1 = STRING_TOKENIZER_get_next_token(tokenizer,local_40,".");
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "Error reading key token STRING";
        iVar1 = 0x91;
        goto LAB_00139e54;
      }
LAB_00139e61:
      local_60 = (STRING_HANDLE)0x0;
      goto LAB_00139c32;
    }
    iVar1 = STRING_TOKENIZER_get_next_token(tokenizer,local_48,"0");
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139e61;
      pcVar2 = "Error reading value token STRING";
      iVar1 = 0x97;
LAB_00139e54:
      local_60 = (STRING_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",iVar1,1,pcVar2);
      goto LAB_00139c32;
    }
    iVar1 = mallocAndStrcpy_s((char **)authInfo,psz);
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139e61;
      pcVar2 = "mallocAndStrcpy_s failed for hostName";
      iVar1 = 0x9d;
      goto LAB_00139e54;
    }
    if ((pcVar2 != (char *)0x0) &&
       (iVar1 = mallocAndStrcpy_s(&authInfo->keyName,pcVar2), iVar1 != 0)) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_00139fea:
        local_60 = (STRING_HANDLE)0x0;
        goto LAB_00139c32;
      }
      pcVar2 = "mallocAndStrcpy_s failed for keyName";
      local_60 = (STRING_HANDLE)0x0;
      iVar1 = 0xa3;
LAB_0013a101:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_service_client_auth.c"
                ,"create_from_connection_string",iVar1,1,pcVar2);
      goto LAB_00139c32;
    }
    if ((pcVar3 != (char *)0x0) &&
       (iVar1 = mallocAndStrcpy_s(&authInfo->deviceId,pcVar3), iVar1 != 0)) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139fea;
      pcVar2 = "mallocAndStrcpy_s failed for keyName";
      local_60 = (STRING_HANDLE)0x0;
      iVar1 = 0xa9;
      goto LAB_0013a101;
    }
    if (useSharedAccessSignature) {
      local_60 = STRING_construct("sas=");
      if ((local_60 != (STRING_HANDLE)0x0) && (iVar1 = STRING_concat(local_60,source), iVar1 == 0))
      {
        pcVar2 = STRING_c_str(local_60);
        iVar1 = mallocAndStrcpy_s(&authInfo->sharedAccessKey,pcVar2);
        if (iVar1 == 0) goto LAB_0013a001;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139c32;
      pcVar2 = "mallocAndStrcpy_s failed for sharedAccessSignature";
      iVar1 = 0xb9;
      goto LAB_0013a101;
    }
    iVar1 = mallocAndStrcpy_s(&authInfo->sharedAccessKey,source);
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00139fea;
      pcVar2 = "mallocAndStrcpy_s failed for sharedAccessKey";
      local_60 = (STRING_HANDLE)0x0;
      iVar1 = 0xaf;
      goto LAB_0013a101;
    }
    local_60 = (STRING_HANDLE)0x0;
LAB_0013a001:
    pcVar2 = STRING_c_str(local_40);
    if (pcVar2 == (char *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "STRING_c_str failed for iothubName";
        iVar1 = 0xbf;
        goto LAB_0013a101;
      }
      goto LAB_00139c32;
    }
    pcVar3 = STRING_c_str(local_48);
    if (pcVar3 == (char *)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "STRING_c_str failed for iothubSuffix";
        iVar1 = 0xc5;
        goto LAB_0013a101;
      }
      goto LAB_00139c32;
    }
    iVar1 = mallocAndStrcpy_s(&authInfo->iothubName,pcVar2);
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "mallocAndStrcpy_s failed for sharedAccessKey";
        iVar1 = 0xcb;
        goto LAB_0013a101;
      }
      goto LAB_00139c32;
    }
    iVar1 = mallocAndStrcpy_s(&authInfo->iothubSuffix,pcVar3);
    if (iVar1 != 0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = "mallocAndStrcpy_s failed for sharedAccessKey";
        iVar1 = 0xd1;
        goto LAB_0013a101;
      }
      goto LAB_00139c32;
    }
  }
  STRING_delete(local_40);
  STRING_delete(local_48);
  STRING_delete(handle_00);
  STRING_TOKENIZER_destroy(tokenizer);
  Map_Destroy(handle);
  if (useSharedAccessSignature) {
    STRING_delete(local_60);
  }
LAB_00139c77:
  STRING_delete(connection_string);
  return authInfo;
}

Assistant:

static IOTHUB_SERVICE_CLIENT_AUTH_HANDLE create_from_connection_string(const char* connectionString, bool useSharedAccessSignature)
{
    IOTHUB_SERVICE_CLIENT_AUTH_HANDLE result;

    if (connectionString == NULL)
    {
        LogError("Input parameter is NULL: connectionString");
        result = NULL;
    }
    else
    {
        result = malloc(sizeof(IOTHUB_SERVICE_CLIENT_AUTH));
        if (result == NULL)
        {
            LogError("Malloc failed for IOTHUB_SERVICE_CLIENT_AUTH");
        }
        else
        {
            memset(result, 0, sizeof(*result));

            STRING_HANDLE connection_string;
            if ((connection_string = STRING_construct(connectionString)) == NULL)
            {
                LogError("STRING_construct failed");
                free_service_client_auth(result);
                result = NULL;
            }
            else
            {
                MAP_HANDLE connection_string_values_map;
                if ((connection_string_values_map = connectionstringparser_parse(connection_string)) == NULL)
                {
                    LogError("Tokenizing failed on connectionString");
                    free_service_client_auth(result);
                    result = NULL;
                }
                else
                {
                    STRING_TOKENIZER_HANDLE tokenizer = NULL;
                    STRING_HANDLE token_key_string = NULL;
                    STRING_HANDLE token_value_string = NULL;
                    STRING_HANDLE host_name_string = NULL;
                    STRING_HANDLE shared_access = NULL;
                    const char* hostName;
                    const char* keyName;
                    const char* deviceId;
                    const char* sharedAccess = NULL;
                    const char* iothubName;
                    const char* iothubSuffix;

                    keyName = Map_GetValueFromKey(connection_string_values_map, IOTHUBSHAREDACESSKEYNAME);
                    deviceId = Map_GetValueFromKey(connection_string_values_map, IOTHUBDEVICEID);

                    (void)memset(result, 0, sizeof(IOTHUB_SERVICE_CLIENT_AUTH));
                    if ((keyName == NULL) && (deviceId == NULL))
                    {
                        LogError("Couldn't find %s or %s in connection string", IOTHUBSHAREDACESSKEYNAME, IOTHUBDEVICEID);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((keyName != NULL) && (deviceId != NULL))
                    {
                        LogError("Both %s and %s in connection string were set, they are mutually exclusive", IOTHUBSHAREDACESSKEYNAME, IOTHUBDEVICEID);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((hostName = Map_GetValueFromKey(connection_string_values_map, IOTHUBHOSTNAME)) == NULL)
                    {
                        LogError("Couldn't find %s in connection string", IOTHUBHOSTNAME);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (!useSharedAccessSignature && (sharedAccess = Map_GetValueFromKey(connection_string_values_map, IOTHUBSHAREDACESSKEY)) == NULL)
                    {
                        LogError("Couldn't find %s in connection string", IOTHUBSHAREDACESSKEY);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (useSharedAccessSignature && (sharedAccess = Map_GetValueFromKey(connection_string_values_map, IOTHUBSHAREDACESSSIGNATURE)) == NULL)
                    {
                        LogError("Couldn't find %s in connection string", IOTHUBSHAREDACESSSIGNATURE);
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((host_name_string = STRING_construct(hostName)) == NULL)
                    {
                        LogError("STRING_construct failed");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((tokenizer = STRING_TOKENIZER_create(host_name_string)) == NULL)
                    {
                        LogError("Error creating STRING tokenizer");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((token_key_string = STRING_new()) == NULL)
                    {
                        LogError("Error creating key token STRING_HANDLE");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((token_value_string = STRING_new()) == NULL)
                    {
                        LogError("Error creating value token STRING_HANDLE");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (STRING_TOKENIZER_get_next_token(tokenizer, token_key_string, ".") != 0)
                    {
                        LogError("Error reading key token STRING");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (STRING_TOKENIZER_get_next_token(tokenizer, token_value_string, "0") != 0)
                    {
                        LogError("Error reading value token STRING");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (mallocAndStrcpy_s(&result->hostname, hostName) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for hostName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((keyName != NULL) && (mallocAndStrcpy_s(&result->keyName, keyName) != 0))
                    {
                        LogError("mallocAndStrcpy_s failed for keyName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((deviceId != NULL) && (mallocAndStrcpy_s(&result->deviceId, deviceId) != 0))
                    {
                        LogError("mallocAndStrcpy_s failed for keyName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (!useSharedAccessSignature && (sharedAccess != NULL) && mallocAndStrcpy_s(&result->sharedAccessKey, sharedAccess) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (useSharedAccessSignature &&
                        (sharedAccess != NULL) &&
                        (((shared_access = STRING_construct(IOTHUBSASPREFIX)) == NULL) ||
                        (STRING_concat(shared_access, sharedAccess) != 0) ||
                        (mallocAndStrcpy_s(&result->sharedAccessKey, STRING_c_str(shared_access)) != 0)))
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessSignature");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((iothubName = STRING_c_str(token_key_string)) == NULL)
                    {
                        LogError("STRING_c_str failed for iothubName");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if ((iothubSuffix = STRING_c_str(token_value_string)) == NULL)
                    {
                        LogError("STRING_c_str failed for iothubSuffix");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (mallocAndStrcpy_s(&result->iothubName, iothubName) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    else if (mallocAndStrcpy_s(&result->iothubSuffix, iothubSuffix) != 0)
                    {
                        LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                        free_service_client_auth(result);
                        result = NULL;
                    }
                    STRING_delete(token_key_string);
                    STRING_delete(token_value_string);
                    STRING_delete(host_name_string);
                    STRING_TOKENIZER_destroy(tokenizer);
                    Map_Destroy(connection_string_values_map);
                    if (useSharedAccessSignature)
                    {
                        STRING_delete(shared_access);
                    }
                }
                STRING_delete(connection_string);
            }
        }
    }
    return result;
}